

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O1

void draw_4_circles(Am_Drawonable *d)

{
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  Am_Style local_80 [8];
  Am_Style local_78 [8];
  Am_Style local_70 [8];
  Am_Style local_68 [8];
  Am_Style local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Style local_48 [8];
  long local_40;
  undefined1 *local_38;
  
  Am_Style::Am_Style(local_58,(Am_Style *)&black);
  Am_Style::Am_Style(local_60,(Am_Style *)&red);
  Am_Style::Am_Style(local_68,(Am_Style *)&black);
  Am_Style::Am_Style(local_70,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_78,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_80,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_48,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_50,(Am_Style *)&Am_No_Style);
  set_style_array(local_58,local_60,local_68,local_70,local_78,local_80,local_48,local_50);
  Am_Style::~Am_Style(local_50);
  Am_Style::~Am_Style(local_48);
  Am_Style::~Am_Style(local_80);
  Am_Style::~Am_Style(local_78);
  Am_Style::~Am_Style(local_70);
  Am_Style::~Am_Style(local_68);
  Am_Style::~Am_Style(local_60);
  Am_Style::~Am_Style(local_58);
  puVar3 = style_array;
  lVar1 = 0;
  do {
    lVar2 = -0x4b;
    local_40 = lVar1;
    local_38 = puVar3;
    do {
      (**(code **)(*(long *)d + 0x130))
                (d,&Am_No_Style,puVar3,(int)lVar1 * 0x4b + 10,(int)lVar2 + 0x55,0x32,0x32,0,0x168,0,
                 1);
      puVar3 = puVar3 + 8;
      lVar2 = lVar2 + 0x4b;
    } while (lVar2 == 0);
    lVar1 = local_40 + 1;
    puVar3 = local_38 + 8;
  } while (local_40 == 0);
  return;
}

Assistant:

void
draw_4_circles(Am_Drawonable *d)
{
  int x_counter, y_counter, x, y;

  set_style_array(black, red, black);
  for (x_counter = 0; x_counter <= 1; x_counter++) {
    for (y_counter = 0; y_counter <= 1; y_counter++) {
      x = 10 + (75 * x_counter);
      y = 10 + (75 * y_counter);
      d->Draw_Arc(Am_No_Style, style_array[x_counter + y_counter], x, y, 50,
                  50);
    }
  }
}